

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

aiNode * __thiscall aiNode::FindNode(aiNode *this,char *name)

{
  int iVar1;
  aiNode *paVar2;
  aiNode *p;
  uint i;
  char *name_local;
  aiNode *this_local;
  
  iVar1 = strcmp((this->mName).data,name);
  this_local = this;
  if (iVar1 != 0) {
    for (p._4_4_ = 0; p._4_4_ < this->mNumChildren; p._4_4_ = p._4_4_ + 1) {
      paVar2 = FindNode(this->mChildren[p._4_4_],name);
      if (paVar2 != (aiNode *)0x0) {
        return paVar2;
      }
    }
    this_local = (aiNode *)0x0;
  }
  return this_local;
}

Assistant:

aiNode *aiNode::FindNode(const char* name) {
    if (!::strcmp(mName.data, name))return this;
    for (unsigned int i = 0; i < mNumChildren; ++i)
    {
        aiNode* const p = mChildren[i]->FindNode(name);
        if (p) {
            return p;
        }
    }
    // there is definitely no sub-node with this name
    return nullptr;
}